

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O2

optional<fs::path> *
node::FindSnapshotChainstateDir(optional<fs::path> *__return_storage_ptr__,path *data_dir)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  long in_FS_OFFSET;
  string local_108;
  path local_e8;
  path local_c0;
  path possible_dir;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_70;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir->super_path);
  tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
            (&local_108,(tinyformat *)"chainstate%s",SNAPSHOT_CHAINSTATE_SUFFIX,in_RCX);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&local_70,local_108._M_dataplus._M_p,
             local_108._M_dataplus._M_p + local_108._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            (&local_50,&local_70,auto_format);
  std::filesystem::__cxx11::path::path(&local_e8,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  std::__cxx11::u8string::~u8string((u8string *)&local_70);
  fs::operator/(&possible_dir,(path *)&local_c0,(path *)&local_e8);
  std::filesystem::__cxx11::path::~path(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::filesystem::__cxx11::path::~path(&local_c0);
  bVar1 = std::filesystem::exists(&possible_dir.super_path);
  if (bVar1) {
    std::optional<fs::path>::optional<fs::path,_true>(__return_storage_ptr__,&possible_dir);
  }
  else {
    (__return_storage_ptr__->super__Optional_base<fs::path,_false,_false>)._M_payload.
    super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
    _M_engaged = false;
  }
  std::filesystem::__cxx11::path::~path(&possible_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<fs::path> FindSnapshotChainstateDir(const fs::path& data_dir)
{
    fs::path possible_dir =
        data_dir / fs::u8path(strprintf("chainstate%s", SNAPSHOT_CHAINSTATE_SUFFIX));

    if (fs::exists(possible_dir)) {
        return possible_dir;
    }
    return std::nullopt;
}